

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O1

int pkcs7_wrap(scep *s)

{
  uchar **parg;
  int iVar1;
  uchar *buf;
  BIO *bp;
  long lVar2;
  stack_st_X509 *certs;
  BIO *pBVar3;
  PKCS7 *p7;
  BIO_METHOD *pBVar4;
  PKCS7 *p7_00;
  PKCS7_SIGNER_INFO *p7si;
  stack_st_X509_ATTRIBUTE *attrs;
  ASN1_OBJECT *data;
  BIO *pBVar5;
  char *fmt;
  X509 *pXVar6;
  EVP_PKEY *pEVar7;
  ulong uVar8;
  uchar *buffer;
  void *local_50;
  BIO *local_48;
  EVP_PKEY *local_40;
  X509 *local_38;
  
  local_50 = (void *)0x0;
  s->sender_nonce_len = 0x10;
  buf = (uchar *)malloc(0x10);
  s->sender_nonce = buf;
  RAND_bytes(buf,0x10);
  switch(s->request_type) {
  case 0x13:
    s->request_type_str = "19";
    pXVar6 = (X509 *)s->signercert;
    pEVar7 = (EVP_PKEY *)s->signerkey;
    log_log(1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0x36,"creating inner PKCS#7");
    pBVar4 = BIO_s_mem();
    bp = BIO_new(pBVar4);
    iVar1 = i2d_X509_REQ_bio(bp,(X509_REQ *)request);
    if (iVar1 < 1) {
      fmt = "error writing certificate request in bio";
      iVar1 = 0x3b;
      goto LAB_0010ab95;
    }
    log_log(1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0x3f,"inner PKCS#7 in mem BIO");
    break;
  case 0x14:
    s->request_type_str = "20";
    pXVar6 = (X509 *)s->signercert;
    pEVar7 = (EVP_PKEY *)s->signerkey;
    log_log(1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0x4d,"creating inner PKCS#7");
    pBVar4 = BIO_s_mem();
    bp = BIO_new(pBVar4);
    iVar1 = i2d_PKCS7_ISSUER_AND_SUBJECT_bio((BIO *)bp,s->ias_getcertinit);
    if (iVar1 < 1) {
      fmt = "error writing GetCertInitial data in bio";
      iVar1 = 0x52;
      goto LAB_0010ab95;
    }
    break;
  case 0x15:
    s->request_type_str = "21";
    pEVar7 = (EVP_PKEY *)rsa;
    pXVar6 = (X509 *)localcert;
    pBVar4 = BIO_s_mem();
    bp = BIO_new(pBVar4);
    iVar1 = i2d_PKCS7_ISSUER_AND_SERIAL_bio((BIO *)bp,s->ias_getcert);
    if (iVar1 < 1) {
      fmt = "error writing GetCert data in bio";
      iVar1 = 99;
      goto LAB_0010ab95;
    }
    break;
  case 0x16:
    s->request_type_str = "22";
    pEVar7 = (EVP_PKEY *)rsa;
    pXVar6 = (X509 *)localcert;
    pBVar4 = BIO_s_mem();
    bp = BIO_new(pBVar4);
    iVar1 = i2d_PKCS7_ISSUER_AND_SERIAL_bio((BIO *)bp,s->ias_getcrl);
    if (iVar1 < 1) {
      fmt = "error writing GetCert data in bio\n";
      iVar1 = 0x74;
      goto LAB_0010ab95;
    }
    break;
  default:
    pXVar6 = (X509 *)0x0;
    pEVar7 = (EVP_PKEY *)0x0;
    bp = (BIO *)0x0;
  }
  lVar2 = BIO_ctrl(bp,0xb,0,(void *)0x0);
  if ((int)lVar2 < 1) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0x7d,"error flushing databio");
  }
  BIO_set_flags(bp,0x200);
  parg = &s->request_payload;
  lVar2 = BIO_ctrl(bp,3,0,parg);
  s->request_len = (int)lVar2;
  if (v_flag != 0) {
    log_log(1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0x86,"request data dump");
    PEM_write_X509_REQ(_stdout,(X509_REQ *)request);
  }
  log_log(1,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,0x8a,"data payload size: %d bytes",(ulong)(uint)s->request_len);
  certs = (stack_st_X509 *)OPENSSL_sk_new(0);
  if (certs == (stack_st_X509 *)0x0) {
    fmt = "error creating certificate stack";
    iVar1 = 0x8e;
  }
  else {
    if (e_flag == 0) {
      iVar1 = OPENSSL_sk_push(certs,cacert);
      if (iVar1 < 1) {
        fmt = "error adding recipient encryption certificate";
        iVar1 = 0x9d;
        goto LAB_0010ab95;
      }
    }
    else {
      iVar1 = OPENSSL_sk_push(certs,encert);
      if (iVar1 < 1) {
        fmt = "error adding recipient encryption certificate";
        iVar1 = 0x96;
        goto LAB_0010ab95;
      }
    }
    local_40 = pEVar7;
    local_38 = pXVar6;
    if (d_flag == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      log_log(0,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
              ,0xa5,"hexdump request payload",0);
      if (0 < s->request_len) {
        uVar8 = 0;
        local_48 = bp;
        do {
          fprintf(_stdout,"%02x ",(ulong)(*parg)[uVar8]);
          uVar8 = uVar8 + 1;
          if ((uVar8 & 7) == 0) {
            fputc(0x20,_stdout);
          }
          if ((uVar8 & 0xf) == 0) {
            fputc(10,_stdout);
          }
          bp = local_48;
        } while ((long)uVar8 < (long)s->request_len);
      }
      fputc(10,_stdout);
    }
    log_log(0,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0xad,"hexdump payload %d",uVar8 & 0xffffffff);
    pBVar3 = BIO_new_mem_buf(s->request_payload,s->request_len);
    if (pBVar3 == (BIO *)0x0) {
      fmt = "error creating data bio";
      iVar1 = 0xb0;
    }
    else {
      p7 = PKCS7_encrypt(certs,pBVar3,(EVP_CIPHER *)enc_alg,0x80);
      if (p7 == (PKCS7 *)0x0) {
        fmt = "request payload encrypt failed";
        iVar1 = 0xb7;
      }
      else {
        log_log(1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                ,0xbb,"successfully encrypted payload");
        pBVar4 = BIO_s_mem();
        pBVar3 = BIO_new(pBVar4);
        iVar1 = i2d_PKCS7_bio(pBVar3,p7);
        if (iVar1 < 1) {
          fmt = "error writing encrypted data";
          iVar1 = 0xc0;
        }
        else {
          BIO_ctrl(pBVar3,0xb,0,(void *)0x0);
          BIO_set_flags(pBVar3,0x200);
          uVar8 = BIO_ctrl(pBVar3,3,0,&local_50);
          log_log(1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                  ,199,"envelope size: %d bytes",uVar8 & 0xffffffff);
          if (d_flag != 0) {
            log_log(0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                    ,0xc9,"printing PEM formatted PKCS#7");
            PEM_write_PKCS7(_stdout,p7);
          }
          BIO_free(pBVar3);
          log_log(1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                  ,0xcf,"creating outer PKCS#7");
          p7_00 = (PKCS7 *)PKCS7_new();
          s->request_p7 = p7_00;
          if (p7_00 == (PKCS7 *)0x0) {
            fmt = "failed creating PKCS#7 for signing";
            iVar1 = 0xd2;
          }
          else {
            iVar1 = PKCS7_set_type((PKCS7 *)p7_00,0x16);
            pXVar6 = local_38;
            pEVar7 = local_40;
            if (iVar1 == 0) {
              fmt = "failed setting PKCS#7 type";
              iVar1 = 0xd7;
            }
            else {
              PKCS7_add_certificate((PKCS7 *)s->request_p7,local_38);
              p7si = PKCS7_add_signature((PKCS7 *)s->request_p7,pXVar6,pEVar7,(EVP_MD *)sig_alg);
              if (p7si == (PKCS7_SIGNER_INFO *)0x0) {
                fmt = "error adding PKCS#7 signature";
                iVar1 = 0xdf;
              }
              else {
                log_log(1,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                        ,0xe3,"signature added successfully");
                log_log(1,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                        ,0xe6,"adding signed attributes");
                attrs = (stack_st_X509_ATTRIBUTE *)OPENSSL_sk_new_null();
                add_attribute_string(attrs,nid_transId,s->transaction_id);
                add_attribute_string(attrs,nid_messageType,s->request_type_str);
                add_attribute_octet(attrs,nid_senderNonce,(char *)s->sender_nonce,
                                    s->sender_nonce_len);
                PKCS7_set_signed_attributes(p7si,(stack_st_X509_ATTRIBUTE *)attrs);
                data = OBJ_nid2obj(0x15);
                iVar1 = PKCS7_add_signed_attribute(p7si,0x32,6,data);
                if (iVar1 == 0) {
                  fmt = "error adding NID_pkcs9_contentType";
                  iVar1 = 0xef;
                }
                else {
                  iVar1 = PKCS7_content_new((PKCS7 *)s->request_p7,0x15);
                  if (iVar1 == 0) {
                    fmt = "failed setting PKCS#7 content type";
                    iVar1 = 0xf6;
                  }
                  else {
                    pBVar3 = PKCS7_dataInit((PKCS7 *)s->request_p7,(BIO *)0x0);
                    if (pBVar3 == (BIO *)0x0) {
                      fmt = "error opening bio for writing PKCS#7 data";
                      iVar1 = 0xfe;
                    }
                    else {
                      iVar1 = BIO_write(pBVar3,local_50,(int)uVar8);
                      if (iVar1 == (int)uVar8) {
                        log_log(1,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                                ,0x107,"PKCS#7 data written successfully");
                        iVar1 = PKCS7_dataFinal((PKCS7 *)s->request_p7,pBVar3);
                        if (iVar1 != 0) {
                          if (d_flag != 0) {
                            log_log(0,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                                    ,0x110,"printing PEM fomatted PKCS#7");
                            PEM_write_PKCS7(_stdout,(PKCS7 *)s->request_p7);
                          }
                          log_log(1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                                  ,0x115,"applying base64 encoding");
                          pBVar4 = BIO_s_mem();
                          pBVar3 = BIO_new(pBVar4);
                          pBVar4 = BIO_f_base64();
                          pBVar5 = BIO_new(pBVar4);
                          pBVar5 = BIO_push(pBVar5,pBVar3);
                          i2d_PKCS7_bio(pBVar5,(PKCS7 *)s->request_p7);
                          BIO_ctrl(pBVar5,0xb,0,(void *)0x0);
                          BIO_set_flags(pBVar3,0x200);
                          uVar8 = BIO_ctrl(pBVar3,3,0,parg);
                          s->request_len = (int)uVar8;
                          log_log(1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                                  ,0x121,"base64 encoded payload size: %d bytes",uVar8 & 0xffffffff)
                          ;
                          BIO_free(pBVar5);
                          BIO_free(bp);
                          return 0;
                        }
                        fmt = "error finalizing outer PKCS#7";
                        iVar1 = 0x10b;
                      }
                      else {
                        fmt = "error writing PKCS#7 data";
                        iVar1 = 0x103;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010ab95:
  log_log(4,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,iVar1,fmt);
  ERR_print_errors_fp(_stderr);
  exit(0x61);
}

Assistant:

int pkcs7_wrap(struct scep *s) {
    BIO                     *databio = NULL;
    BIO                     *encbio = NULL;
    BIO                     *pkcs7bio = NULL;
    BIO                     *memorybio = NULL;
    BIO                     *outbio = NULL;
    BIO                     *base64bio = NULL;
    unsigned char           *buffer = NULL;
    int                     rc, len = 0, i=0;
    STACK_OF(X509)          *recipients;
    PKCS7                   *p7enc;
    PKCS7_SIGNER_INFO       *si;
    X509_ATTRIBUTE_STACK    *attributes;
    X509                    *signercert = NULL;
    EVP_PKEY                *signerkey = NULL;
    X509_REQ                *reqcsr = NULL;

    // Create a new sender nonce for all messages XXXXXXXXXXXXXX should it be per transaction?
    s->sender_nonce_len = 16;
    s->sender_nonce = malloc(s->sender_nonce_len);
    RAND_bytes(s->sender_nonce, s->sender_nonce_len);

    // Prepare data payload
    switch(s->request_type) {
        case SCEP_REQUEST_PKCSREQ:
            // Set printable message type
            // We set this later as an autheticated attribute "messageType".
            s->request_type_str = SCEP_REQUEST_PKCSREQ_STR;

            // Signer cert
            signercert = s->signercert;
            signerkey = s->signerkey;

            // Create inner PKCS#7
            log_debug("creating inner PKCS#7");

            // Read request in memory bio
            databio = BIO_new(BIO_s_mem());
            if ((rc = i2d_X509_REQ_bio(databio, request)) <= 0) {
                log_error("error writing certificate request in bio");
                ERR_print_errors_fp(stderr);
                exit(SCEP_PKISTATUS_P7);
            } else {
                log_debug("inner PKCS#7 in mem BIO");
            }
            break;

        case SCEP_REQUEST_GETCERTINIT:

            // Set printable message type
            s->request_type_str = SCEP_REQUEST_GETCERTINIT_STR;

            // Signer cert
            signercert = s->signercert;
            signerkey = s->signerkey;

            // Create inner PKCS#7
            log_debug("creating inner PKCS#7");

            // Read data in memory bio
            databio = BIO_new(BIO_s_mem());
            if ((rc = i2d_PKCS7_ISSUER_AND_SUBJECT_bio(databio, s->ias_getcertinit)) <= 0) {
                log_error("error writing GetCertInitial data in bio");
                ERR_print_errors_fp(stderr);
                exit (SCEP_PKISTATUS_P7);
            }
            break;

        case SCEP_REQUEST_GETCERT:
            // Set printable message type
            s->request_type_str = SCEP_REQUEST_GETCERT_STR;

            // Signer cert
            signercert = localcert;
            signerkey = rsa;

            // Read data in memory bio
            databio = BIO_new(BIO_s_mem());
            if ((rc = i2d_PKCS7_ISSUER_AND_SERIAL_bio(databio, s->ias_getcert)) <= 0) {
                log_error("error writing GetCert data in bio");
                ERR_print_errors_fp(stderr);
                exit (SCEP_PKISTATUS_P7);
            }
            break;

        case SCEP_REQUEST_GETCRL:
            // Set printable message type
            s->request_type_str = SCEP_REQUEST_GETCRL_STR;

            // Signer cert
            signercert = localcert;
            signerkey = rsa;

            // Read data in memory bio
            databio = BIO_new(BIO_s_mem());
            if ((rc = i2d_PKCS7_ISSUER_AND_SERIAL_bio(databio, s->ias_getcrl)) <= 0) {
                log_error("error writing GetCert data in bio\n");
                ERR_print_errors_fp(stderr);
                exit(SCEP_PKISTATUS_P7);
            }

            break;
    }

    if( BIO_flush(databio) <= 0 ){
        log_error("error flushing databio");
    }
    BIO_set_flags(databio, BIO_FLAGS_MEM_RDONLY);

    // Below this is the common code for all request_type

    // Read in the payload
    s->request_len = BIO_get_mem_data(databio, &s->request_payload);
    if (v_flag){
        log_debug("request data dump");
        PEM_write_X509_REQ(stdout, request);
    }

    log_debug("data payload size: %d bytes", s->request_len);

    // Create encryption certificate stack
    if ((recipients = sk_X509_new(NULL)) == NULL) {
        log_error("error creating certificate stack");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }

    // Use different CA cert for encryption if requested
    if (e_flag) {
        if (sk_X509_push(recipients, encert) <= 0) {
            log_error("error adding recipient encryption certificate");
            ERR_print_errors_fp(stderr);
            exit (SCEP_PKISTATUS_P7);
        }
    } else {
        // Use same CA cert also for encryption
        if (sk_X509_push(recipients, cacert) <= 0) {
            log_error("error adding recipient encryption certificate");
            ERR_print_errors_fp(stderr);
            exit (SCEP_PKISTATUS_P7);
        }
    }

    // Create BIO for encryption
    if (d_flag){
        log_trace("hexdump request payload", i);
        for(i=0; i < s->request_len; i++ ) {
            fprintf(stdout, "%02x ", s->request_payload[i]);
            if ((i + 1) % 8 == 0) fprintf(stdout, " ");
            if ((i + 1) % 16 == 0) fprintf(stdout, "\n");
        }
        fprintf(stdout, "\n");
    }
    log_trace("hexdump payload %d", i);

    if ((encbio = BIO_new_mem_buf(s->request_payload, s->request_len)) == NULL) {
        log_error("error creating data bio");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }

    // Encrypt
    if (!(p7enc = PKCS7_encrypt(recipients, encbio, enc_alg, PKCS7_BINARY))) {
        log_error("request payload encrypt failed");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }
    log_debug("successfully encrypted payload");

    // Write encrypted data
    memorybio = BIO_new(BIO_s_mem());
    if (i2d_PKCS7_bio(memorybio, p7enc) <= 0) {
        log_error("error writing encrypted data");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }
    BIO_flush(memorybio);
    BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
    len = BIO_get_mem_data(memorybio, &buffer);
    log_debug("envelope size: %d bytes", len);
    if (d_flag) {
        log_trace("printing PEM formatted PKCS#7");
        PEM_write_PKCS7(stdout, p7enc);
    }
    BIO_free(memorybio);

    // Create outer PKCS#7
    log_debug("creating outer PKCS#7");
    s->request_p7 = PKCS7_new();
    if (s->request_p7 == NULL) {
        log_error("failed creating PKCS#7 for signing");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }
    if (!PKCS7_set_type(s->request_p7, NID_pkcs7_signed)) {
        log_error("failed setting PKCS#7 type");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }

    // Add signer certificate and signature
    PKCS7_add_certificate(s->request_p7, signercert);
    if ((si = PKCS7_add_signature(s->request_p7, signercert, signerkey, sig_alg)) == NULL) {
        log_error("error adding PKCS#7 signature");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }
    log_debug("signature added successfully");

    // Set signed attributes
    log_debug("adding signed attributes");
    attributes = sk_X509_ATTRIBUTE_new_null();
    add_attribute_string(attributes, nid_transId, s->transaction_id);
    add_attribute_string(attributes, nid_messageType, s->request_type_str);
    add_attribute_octet(attributes, nid_senderNonce, s->sender_nonce, s->sender_nonce_len);
    PKCS7_set_signed_attributes(si, attributes);

    // Add contentType
    if (!PKCS7_add_signed_attribute(si, NID_pkcs9_contentType, V_ASN1_OBJECT, OBJ_nid2obj(NID_pkcs7_data))) {
        log_error("error adding NID_pkcs9_contentType");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }

    // Create new content
    if (!PKCS7_content_new(s->request_p7, NID_pkcs7_data)) {
        log_error("failed setting PKCS#7 content type");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }

    // Write data
    pkcs7bio = PKCS7_dataInit(s->request_p7, NULL);
    if (pkcs7bio == NULL) {
        log_error("error opening bio for writing PKCS#7 data");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }
    if (len != BIO_write(pkcs7bio, buffer, len)) {
        log_error("error writing PKCS#7 data");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }
    log_debug("PKCS#7 data written successfully");

    // Finalize PKCS#7
    if (!PKCS7_dataFinal(s->request_p7, pkcs7bio)) {
        log_error("error finalizing outer PKCS#7");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }
    if (d_flag) {
        log_trace("printing PEM fomatted PKCS#7");
        PEM_write_PKCS7(stdout, s->request_p7);
    }

    // base64-encode the data
    log_debug("applying base64 encoding");

    // Create base64 filtering bio
    memorybio = BIO_new(BIO_s_mem());
    base64bio = BIO_new(BIO_f_base64());
    outbio = BIO_push(base64bio, memorybio);

    // Copy PKCS#7
    i2d_PKCS7_bio(outbio, s->request_p7);
    BIO_flush(outbio);
    BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
    s->request_len = BIO_get_mem_data(memorybio, &s->request_payload);
    log_debug("base64 encoded payload size: %d bytes", s->request_len);
    BIO_free(outbio);
    BIO_free(databio);
    return (0);
}